

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageOneofFieldGenerator::GenerateSerializedSizeCode
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  MessageOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if ($has_oneof_case$) {\n  size += com.google.protobuf.nano.CodedOutputByteBufferNano\n    .computeMessageSize($number$,\n        (com.google.protobuf.nano.MessageNano) this.$oneof_name$_);\n}\n"
                    );
  return;
}

Assistant:

void MessageOneofFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if ($has_oneof_case$) {\n"
    "  size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
    "    .computeMessageSize($number$,\n"
    "        (com.google.protobuf.nano.MessageNano) this.$oneof_name$_);\n"
    "}\n");
}